

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaWriterFinish(PmaWriter *p,i64 *piEof)

{
  int iVar1;
  int rc;
  i64 *piEof_local;
  PmaWriter *p_local;
  
  if (((p->eFWErr == 0) && (p->aBuffer != (u8 *)0x0)) && (p->iBufStart < p->iBufEnd)) {
    iVar1 = sqlite3OsWrite(p->pFd,p->aBuffer + p->iBufStart,p->iBufEnd - p->iBufStart,
                           p->iWriteOff + (long)p->iBufStart);
    p->eFWErr = iVar1;
  }
  *piEof = p->iWriteOff + (long)p->iBufEnd;
  sqlite3_free(p->aBuffer);
  iVar1 = p->eFWErr;
  memset(p,0,0x30);
  return iVar1;
}

Assistant:

static int vdbePmaWriterFinish(PmaWriter *p, i64 *piEof){
  int rc;
  if( p->eFWErr==0 && ALWAYS(p->aBuffer) && p->iBufEnd>p->iBufStart ){
    p->eFWErr = sqlite3OsWrite(p->pFd, 
        &p->aBuffer[p->iBufStart], p->iBufEnd - p->iBufStart, 
        p->iWriteOff + p->iBufStart
    );
  }
  *piEof = (p->iWriteOff + p->iBufEnd);
  sqlite3_free(p->aBuffer);
  rc = p->eFWErr;
  memset(p, 0, sizeof(PmaWriter));
  return rc;
}